

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

Abc_Obj_t * Io_ReadCreateLatch(Abc_Ntk_t *pNtk,char *pNetLI,char *pNetLO)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNetLI);
  pAVar2 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
  Abc_ObjAddFanin(pAVar2,pAVar1);
  pAVar1 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
  Abc_ObjAddFanin(pAVar1,pAVar2);
  pAVar2 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
  Abc_ObjAddFanin(pAVar2,pAVar1);
  pObj = Abc_NtkFindOrCreateNet(pNtk,pNetLO);
  Abc_ObjAddFanin(pObj,pAVar2);
  Abc_ObjAssignName(pAVar1,pNetLO,"L");
  return pAVar1;
}

Assistant:

Abc_Obj_t * Io_ReadCreateLatch( Abc_Ntk_t * pNtk, char * pNetLI, char * pNetLO )
{
    Abc_Obj_t * pLatch, * pTerm, * pNet;
    // get the LI net
    pNet = Abc_NtkFindOrCreateNet( pNtk, pNetLI );
    // add the BO terminal
    pTerm = Abc_NtkCreateBi( pNtk );
    Abc_ObjAddFanin( pTerm, pNet );
    // add the latch box
    pLatch = Abc_NtkCreateLatch( pNtk );
    Abc_ObjAddFanin( pLatch, pTerm  );
    // add the BI terminal
    pTerm = Abc_NtkCreateBo( pNtk );
    Abc_ObjAddFanin( pTerm, pLatch );
    // get the LO net
    pNet = Abc_NtkFindOrCreateNet( pNtk, pNetLO );
    Abc_ObjAddFanin( pNet, pTerm );
    // set latch name
    Abc_ObjAssignName( pLatch, pNetLO, "L" );
    return pLatch;
}